

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GTestPluginManager.cpp
# Opt level: O0

void __thiscall
TestPluginManager_statefulPluginReload_Test::TestBody
          (TestPluginManager_statefulPluginReload_Test *this)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar2;
  type pPVar3;
  element_type *peVar4;
  Message *pMVar5;
  char *pcVar6;
  char *in_R9;
  AssertHelper local_1e8;
  Message local_1e0;
  int local_1d4;
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_4;
  shared_ptr<plugin::interfaces::IStatefulPluginInterface> sp;
  string local_1a8;
  AssertHelper local_188;
  Message local_180;
  bool local_171;
  undefined1 local_170 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_140;
  Message local_138;
  bool local_129;
  undefined1 local_128 [8];
  AssertionResult gtest_ar_;
  Message local_110;
  int local_104;
  undefined1 local_100 [8];
  AssertionResult gtest_ar_3;
  Message local_e8;
  element_type *local_e0;
  element_type *local_d8;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar_2;
  shared_ptr<plugin::interfaces::IStatefulPluginInterface> sp2;
  Message local_a8;
  int local_9c;
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  int testValue;
  Message local_78;
  int local_6c;
  undefined1 local_68 [8];
  AssertionResult gtest_ar;
  shared_ptr<plugin::interfaces::IStatefulPluginInterface> sp_1;
  shared_ptr<plugin::interfaces::IStatefulPluginInterface> local_38;
  undefined1 local_28 [8];
  weak_ptr<plugin::interfaces::IStatefulPluginInterface> wp;
  __single_object pm;
  TestPluginManager_statefulPluginReload_Test *this_local;
  
  p_Var1 = &wp.
            super___weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  std::make_unique<plugin::PluginManager,char_const(&)[26]>((char (*) [26])p_Var1);
  pPVar3 = std::unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::
           operator*((unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>
                      *)p_Var1);
  plugin::helpers::
  GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface,plugin::interfaces::IStatefulPluginInterface>
            ((helpers *)&local_38,pPVar3);
  std::weak_ptr<plugin::interfaces::IStatefulPluginInterface>::
  weak_ptr<plugin::interfaces::IStatefulPluginInterface,void>
            ((weak_ptr<plugin::interfaces::IStatefulPluginInterface> *)local_28,&local_38);
  std::shared_ptr<plugin::interfaces::IStatefulPluginInterface>::~shared_ptr(&local_38);
  std::weak_ptr<plugin::interfaces::IStatefulPluginInterface>::lock
            ((weak_ptr<plugin::interfaces::IStatefulPluginInterface> *)&gtest_ar.message_);
  peVar4 = std::
           __shared_ptr_access<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  local_6c = (**(code **)(*(long *)peVar4 + 0x28))();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_68,"plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE",
             "sp->GetNumber()",&plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE,
             &local_6c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_68);
  if (!bVar2) {
    testing::Message::Message(&local_78);
    pMVar5 = testing::Message::operator<<
                       (&local_78,(char (*) [43])"The initial value is not what was expected");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_68);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffff80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x82,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xffffffffffffff80,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffff80);
    testing::Message::~Message(&local_78);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_68);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_4_ = 0x2a;
  peVar4 = std::
           __shared_ptr_access<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  (**(code **)(*(long *)peVar4 + 0x20))(peVar4,0x2a);
  peVar4 = std::
           __shared_ptr_access<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar.message_);
  local_9c = (**(code **)(*(long *)peVar4 + 0x28))();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_98,"testValue","sp->GetNumber()",
             (int *)((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4),&local_9c);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar2) {
    testing::Message::Message(&local_a8);
    pMVar5 = testing::Message::operator<<
                       (&local_a8,(char (*) [39])"The new value is not what was expected");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)
               &sp2.
                super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x86,pcVar6);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)
               &sp2.
                super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,pMVar5);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)
               &sp2.
                super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    testing::Message::~Message(&local_a8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  pPVar3 = std::unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::
           operator*((unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>
                      *)&wp.
                         super___weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount);
  plugin::helpers::
  GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface,plugin::interfaces::IStatefulPluginInterface>
            ((helpers *)&gtest_ar_2.message_,pPVar3);
  local_d8 = std::
             __shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
             ::get((__shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                    *)&gtest_ar.message_);
  local_e0 = std::
             __shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
             ::get((__shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                    *)&gtest_ar_2.message_);
  testing::internal::EqHelper::
  Compare<plugin::interfaces::IStatefulPluginInterface_*,_plugin::interfaces::IStatefulPluginInterface_*,_nullptr>
            ((EqHelper *)local_d0,"sp.get()","sp2.get()",&local_d8,&local_e0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar2) {
    testing::Message::Message(&local_e8);
    pMVar5 = testing::Message::operator<<
                       (&local_e8,
                        (char (*) [68])
                        "Getting the interface again does NOT return the same shared pointer");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x89,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  peVar4 = std::
           __shared_ptr_access<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_2.message_);
  local_104 = (**(code **)(*(long *)peVar4 + 0x28))();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_100,"testValue","sp2->GetNumber()",
             (int *)((long)&gtest_ar_1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    + 4),&local_104);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar2) {
    testing::Message::Message(&local_110);
    pMVar5 = testing::Message::operator<<
                       (&local_110,
                        (char (*) [84])
                        "Getting another pointer to the same interface does NOT give the same internal state"
                       );
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x8a,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,pMVar5);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_110);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::shared_ptr<plugin::interfaces::IStatefulPluginInterface>::~shared_ptr
            ((shared_ptr<plugin::interfaces::IStatefulPluginInterface> *)&gtest_ar_2.message_);
  std::shared_ptr<plugin::interfaces::IStatefulPluginInterface>::~shared_ptr
            ((shared_ptr<plugin::interfaces::IStatefulPluginInterface> *)&gtest_ar.message_);
  local_129 = std::
              __weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>::
              expired((__weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                       *)local_28);
  local_129 = !local_129;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_128,&local_129,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_128);
  if (!bVar2) {
    testing::Message::Message(&local_138);
    pMVar5 = testing::Message::operator<<
                       (&local_138,
                        (char (*) [55])"The plugin object was deleted, but should still exist.");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__1.message_,(internal *)local_128,
               (AssertionResult *)"wp.expired()","true","false",in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_140,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x8d,pcVar6);
    testing::internal::AssertHelper::operator=(&local_140,pMVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_140);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(&local_138);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_128);
  std::unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::reset
            ((unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_> *)
             &wp.
              super___weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,(pointer)0x0);
  local_171 = std::
              __weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>::
              expired((__weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                       *)local_28);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_170,&local_171,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_170);
  if (!bVar2) {
    testing::Message::Message(&local_180);
    pMVar5 = testing::Message::operator<<
                       (&local_180,
                        (char (*) [70])
                        "The plugin object WAS NOT deleted after unloading the plugin manager.");
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_1a8,(internal *)local_170,(AssertionResult *)"wp.expired()","false","true",
               in_R9);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_188,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x91,pcVar6);
    testing::internal::AssertHelper::operator=(&local_188,pMVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    testing::Message::~Message(&local_180);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_170);
  std::make_unique<plugin::PluginManager,char_const(&)[26]>
            ((char (*) [26])
             &sp.
              super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  p_Var1 = &wp.
            super___weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount;
  this_00 = &sp.
             super___shared_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount;
  std::unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::operator=
            ((unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_> *)
             p_Var1,(unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>
                     *)this_00);
  std::unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::~unique_ptr
            ((unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_> *)
             this_00);
  pPVar3 = std::unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::
           operator*((unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>
                      *)p_Var1);
  plugin::helpers::
  GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface,plugin::interfaces::IStatefulPluginInterface>
            ((helpers *)&gtest_ar_4.message_,pPVar3);
  peVar4 = std::
           __shared_ptr_access<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&gtest_ar_4.message_);
  local_1d4 = (**(code **)(*(long *)peVar4 + 0x28))();
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1d0,"plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE",
             "sp->GetNumber()",&plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE,
             &local_1d4);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar2) {
    testing::Message::Message(&local_1e0);
    pMVar5 = testing::Message::operator<<
                       (&local_1e0,
                        (char (*) [71])
                        "The initial value is not what was expected after reloading the plugins");
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidachon[P]PluginManager/Test/GTestPluginManager.cpp"
               ,0x98,pcVar6);
    testing::internal::AssertHelper::operator=(&local_1e8,pMVar5);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  std::shared_ptr<plugin::interfaces::IStatefulPluginInterface>::~shared_ptr
            ((shared_ptr<plugin::interfaces::IStatefulPluginInterface> *)&gtest_ar_4.message_);
  std::weak_ptr<plugin::interfaces::IStatefulPluginInterface>::~weak_ptr
            ((weak_ptr<plugin::interfaces::IStatefulPluginInterface> *)local_28);
  std::unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_>::~unique_ptr
            ((unique_ptr<plugin::PluginManager,_std::default_delete<plugin::PluginManager>_> *)
             &wp.
              super___weak_ptr<plugin::interfaces::IStatefulPluginInterface,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount);
  return;
}

Assistant:

TEST(TestPluginManager, statefulPluginReload)
{
    auto pm = std::make_unique<plugin::PluginManager>("statefulplugintest.pb.txt");

    std::weak_ptr<plugin::interfaces::IStatefulPluginInterface> wp = plugin::helpers::GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface>(*pm);

    { // artificial scope to ensure that the shared pointers go out of scope
        auto const sp = wp.lock();

        EXPECT_EQ(plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE, sp->GetNumber()) << "The initial value is not what was expected";

        auto const testValue = 42;
        sp->SetNumber(testValue);
        EXPECT_EQ(testValue, sp->GetNumber()) << "The new value is not what was expected";

        auto const sp2 = plugin::helpers::GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface>(*pm);
        EXPECT_EQ(sp.get(), sp2.get()) << "Getting the interface again does NOT return the same shared pointer";
        EXPECT_EQ(testValue, sp2->GetNumber()) << "Getting another pointer to the same interface does NOT give the same internal state";
    }

    EXPECT_FALSE(wp.expired()) << "The plugin object was deleted, but should still exist.";

    // Unload the plugins by deleting the plugin manager instance
    pm.reset();
    EXPECT_TRUE(wp.expired()) << "The plugin object WAS NOT deleted after unloading the plugin manager.";

    // Load a new plugin manager
    pm = std::make_unique<plugin::PluginManager>("statefulplugintest.pb.txt");

    // .. and make sure that it gives fresh interface instances
    auto const sp = plugin::helpers::GetSinglePlugin<plugin::interfaces::IStatefulPluginInterface>(*pm);
    EXPECT_EQ(plugin::interfaces::IStatefulPluginInterface::DEFAULT_VALUE, sp->GetNumber()) << "The initial value is not what was expected after reloading the plugins";
}